

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O2

void digest_(Spec_Hash_Definitions_hash_alg a,Hacl_Hash_SHA3_state_t *state,uint8_t *output,
            uint32_t l)

{
  uint64_t *__src;
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t *blocks;
  uint32_t i;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint32_t i_2;
  uint32_t i0;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint8_t *input;
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint64_t buf [25];
  uint8_t hbuf [256];
  ulong local_308;
  uint uStack_300;
  uint uStack_2fc;
  undefined8 local_2f8;
  uint local_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  ulong local_2d0;
  uint uStack_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined8 uStack_248;
  uint8_t *local_240;
  undefined8 local_238 [32];
  undefined8 local_138 [25];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined8 local_40;
  uint uVar28;
  
  __src = (state->block_state).snd;
  local_240 = state->buf;
  uVar12 = state->total_len;
  uVar4 = block_len(a);
  uVar5 = block_len(a);
  if ((uVar12 == 0) || (uVar12 % (ulong)uVar4 != 0)) {
    uVar5 = (uint32_t)(uVar12 % (ulong)uVar5);
  }
  memset(&local_308,0,200);
  memcpy(&local_308,__src,200);
  uVar4 = block_len(a);
  uVar6 = block_len(a);
  blocks = local_240;
  uVar12 = (ulong)uVar6;
  if ((uVar5 == 0) || ((byte)((byte)uVar5 % (byte)uVar4) != 0)) {
    uVar12 = (ulong)(byte)(((ushort)uVar5 & 0xff) % (ushort)(byte)uVar6);
  }
  input = local_240 + (uVar5 - uVar12);
  block_len(a);
  uVar10 = 0;
  Hacl_Hash_SHA3_update_multi_sha3(a,&local_308,blocks,0);
  Hacl_Hash_SHA3_update_last_sha3(a,&local_308,input,uVar5);
  if ((a & 0xfe) == 0xc) {
    for (; uVar4 = block_len(a), uVar10 < l / uVar4; uVar10 = uVar10 + 1) {
      memset(local_238,0,0x100);
      local_50 = (undefined1  [16])0x0;
      local_60 = (undefined1  [16])0x0;
      local_70 = (undefined1  [16])0x0;
      local_40 = 0;
      memcpy(local_138,&local_308,200);
      for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
        local_238[lVar7] = local_138[lVar7];
      }
      uVar4 = block_len(a);
      uVar5 = block_len(a);
      memcpy(output + uVar4 * uVar10,local_238,(ulong)uVar5);
      for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
        auVar29._4_4_ = uStack_2dc;
        auVar29._0_4_ = local_2e0;
        auVar29._8_4_ = uStack_2d8;
        auVar29._12_4_ = uStack_2d4;
        auVar22._4_4_ = uStack_2e4;
        auVar22._0_4_ = uStack_2e8;
        auVar22._8_4_ = local_2e0;
        auVar22._12_4_ = uStack_2dc;
        auVar21._4_4_ = uStack_2d4;
        auVar21._0_4_ = uStack_2d8;
        auVar21._8_8_ = local_2d0;
        auVar24._8_4_ = uStack_300;
        auVar24._0_8_ = local_308;
        auVar24._12_4_ = uStack_2fc;
        auVar32._0_8_ = local_298._8_8_;
        auVar32._8_8_ = local_288._0_8_;
        uVar28 = local_258._12_4_ ^ uStack_2ec ^ uStack_2c4 ^ local_278._4_4_ ^ local_2a8._12_4_;
        auVar27._0_8_ =
             CONCAT44(uVar28,local_258._8_4_ ^ local_2f0 ^
                             uStack_2c8 ^ (uint)local_278 ^ local_2a8._8_4_);
        auVar27._8_4_ =
             (uint)uStack_248 ^ uStack_2e8 ^ uStack_2c0 ^ (uint)uStack_270 ^ local_298._0_4_;
        auVar27._12_4_ =
             uStack_248._4_4_ ^ uStack_2e4 ^ uStack_2bc ^ uStack_270._4_4_ ^ local_298._4_4_;
        local_2d0 = local_2a8._0_8_ ^ local_288._8_8_ ^ local_258._0_8_ ^ local_2f8 ^ local_2d0;
        auVar29 = auVar24 ^ local_2b8 ^ local_268 ^ auVar32 ^ auVar29;
        auVar25._0_8_ = local_2d0 >> 0x3f;
        auVar25._8_4_ = uVar28 >> 0x1f;
        auVar25._12_4_ = 0;
        auVar23._8_8_ = auVar27._0_8_ * 2;
        auVar23._0_8_ = local_2d0 * 2;
        auVar24 = (auVar23 | auVar25) ^ auVar29;
        auVar30._0_8_ = auVar29._0_8_ >> 0x3f;
        auVar30._8_8_ = auVar29._8_8_ >> 0x3f;
        auVar26._8_8_ = auVar29._8_8_ * 2;
        auVar26._0_8_ = auVar29._0_8_ * 2;
        auVar29 = (auVar26 | auVar30) ^ auVar27;
        local_308 = local_308 ^ auVar29._8_8_;
        uVar11 = auVar24._0_8_ ^ CONCAT44(uStack_2fc,uStack_300);
        uStack_300 = (uint)uVar11;
        uStack_2fc = (uint)(uVar11 >> 0x20);
        auVar31._0_8_ = auVar24._8_8_;
        local_2f8 = auVar31._0_8_ ^ local_2f8;
        lVar9 = CONCAT44(auVar27._12_4_,auVar27._8_4_);
        uVar8 = (lVar9 << 1 | (ulong)((int)auVar27._12_4_ < 0)) ^ local_2d0;
        uVar12 = CONCAT44(uStack_2ec,local_2f0) ^ uVar8;
        local_2f0 = (uint)uVar12;
        uStack_2ec = (uint)(uVar12 >> 0x20);
        auVar33._8_4_ = auVar24._0_4_;
        auVar33._0_8_ = auVar29._8_8_;
        auVar33._12_4_ = auVar24._4_4_;
        auVar31._8_8_ = uVar8;
        local_268 = local_268 ^ auVar33;
        local_258 = local_258 ^ auVar31;
        auVar21 = auVar21 ^ auVar24;
        auVar22 = auVar22 ^ auVar29;
        uStack_2e8 = auVar22._0_4_;
        uStack_2e4 = auVar22._4_4_;
        local_2e0 = auVar22._8_4_;
        uStack_2dc = auVar22._12_4_;
        uStack_2d8 = auVar21._0_4_;
        uStack_2d4 = auVar21._4_4_;
        local_2d0 = auVar21._8_8_;
        uVar28 = (uint)(uVar8 >> 0x20);
        uStack_2c8 = uStack_2c8 ^ (uint)uVar8;
        uStack_2c4 = uStack_2c4 ^ uVar28;
        uStack_2c0 = uStack_2c0 ^ auVar29._0_4_;
        uStack_2bc = uStack_2bc ^ auVar29._4_4_;
        local_2b8 = auVar33 ^ local_2b8;
        local_298 = auVar29 ^ local_298;
        local_2a8 = auVar31 ^ local_2a8;
        local_288 = auVar24 ^ local_288;
        local_278 = CONCAT44(uVar28 ^ local_278._4_4_,(uint)uVar8 ^ (uint)local_278);
        uStack_270 = CONCAT44(auVar29._4_4_ ^ uStack_270._4_4_,auVar29._0_4_ ^ (uint)uStack_270);
        uStack_248 = uStack_248 ^ auVar29._0_8_;
        for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 1) {
          bVar1 = (byte)Hacl_Hash_SHA3_keccak_rotc[lVar9] & 0x3f;
          uVar12 = uVar11 << bVar1;
          uVar8 = uVar11 >> 0x40 - bVar1;
          uVar11 = (&local_308)[Hacl_Hash_SHA3_keccak_piln[lVar9]];
          (&local_308)[Hacl_Hash_SHA3_keccak_piln[lVar9]] = uVar12 | uVar8;
        }
        auVar19._4_4_ = uStack_2ec;
        auVar19._0_4_ = local_2f0;
        auVar19._8_4_ = uStack_2e8;
        auVar19._12_4_ = uStack_2e4;
        uVar11 = ~CONCAT44(uStack_2fc,uStack_300) & local_2f8;
        auVar18._0_8_ = auVar19._8_8_;
        auVar18._8_8_ = local_308;
        auVar2._8_4_ = uStack_300;
        auVar2._0_8_ = local_308;
        auVar2._12_4_ = uStack_2fc;
        auVar19 = ~auVar18 & auVar2 ^ auVar19;
        uStack_300 = ~(uint)local_2f8 & local_2f0 ^ uStack_300;
        uStack_2fc = ~local_2f8._4_4_ & uStack_2ec ^ uStack_2fc;
        local_2f8 = CONCAT44(~uStack_2ec & uStack_2e4 ^ local_2f8._4_4_,
                             ~local_2f0 & uStack_2e8 ^ (uint)local_2f8);
        local_2f0 = auVar19._0_4_;
        uStack_2ec = auVar19._4_4_;
        uStack_2e8 = auVar19._8_4_;
        uStack_2e4 = auVar19._12_4_;
        uVar12 = CONCAT44(uStack_2dc,local_2e0);
        auVar3._4_4_ = uStack_2c4;
        auVar3._0_4_ = uStack_2c8;
        auVar3._8_4_ = uStack_2c0;
        auVar3._12_4_ = uStack_2bc;
        uVar16 = (uint)(local_2d0 >> 0x20);
        auVar20._0_8_ = auVar3._8_8_;
        auVar20._8_8_ = uVar12;
        uVar28 = ~(uint)local_2d0 & uStack_2c8;
        uVar17 = ~uVar16 & uStack_2c4;
        local_2e0 = ~uStack_2d8 & (uint)local_2d0 ^ local_2e0;
        uStack_2dc = ~uStack_2d4 & uVar16 ^ uStack_2dc;
        auVar15._8_4_ = uStack_2c8;
        auVar15._0_8_ = local_2d0;
        auVar15._12_4_ = uStack_2c4;
        auVar15 = ~auVar3 & auVar20 ^ auVar15;
        local_2d0 = auVar15._0_8_;
        uStack_2c8 = auVar15._8_4_;
        uStack_2c4 = auVar15._12_4_;
        uVar12 = CONCAT44(uStack_2bc,uStack_2c0) ^ ~uVar12 & CONCAT44(uStack_2d4,uStack_2d8);
        uStack_2c0 = (uint)uVar12;
        uStack_2bc = (uint)(uVar12 >> 0x20);
        uVar8 = ~local_2b8._8_8_;
        uVar13 = ~local_2a8._8_8_;
        uVar14 = ~local_298._0_8_ & local_2b8._0_8_;
        uVar12 = ~local_2b8._0_8_ & local_2b8._8_8_;
        local_2b8._8_8_ = ~local_2a8._0_8_ & local_2a8._8_8_ ^ local_2b8._8_8_;
        local_2b8._0_8_ = uVar8 & local_2a8._0_8_ ^ local_2b8._0_8_;
        local_2a8._8_8_ = uVar14 ^ local_2a8._8_8_;
        local_2a8._0_8_ = uVar13 & local_298._0_8_ ^ local_2a8._0_8_;
        uVar13 = ~local_278 & uStack_270;
        uVar8 = ~local_288._8_8_ & local_278;
        local_278 = ~uStack_270 & local_298._8_8_ ^ local_278;
        uStack_270 = ~local_298._8_8_ & local_288._0_8_ ^ uStack_270;
        local_298._8_8_ = ~local_288._0_8_ & local_288._8_8_ ^ local_298._8_8_;
        local_298._0_8_ = uVar12 ^ local_298._0_8_;
        local_288._8_8_ = uVar13 ^ local_288._8_8_;
        local_288._0_8_ = uVar8 ^ local_288._0_8_;
        uVar12 = ~local_268._8_8_;
        uVar8 = ~local_258._8_8_ & uStack_248;
        uVar13 = ~uStack_248 & local_268._0_8_;
        uStack_248 = ~local_268._0_8_ & local_268._8_8_ ^ uStack_248;
        local_268._8_8_ = ~local_258._0_8_ & local_258._8_8_ ^ local_268._8_8_;
        local_268._0_8_ = uVar12 & local_258._0_8_ ^ local_268._0_8_;
        local_258._8_8_ = uVar13 ^ local_258._8_8_;
        local_258._0_8_ = uVar8 ^ local_258._0_8_;
        local_308 = uVar11 ^ Hacl_Hash_SHA3_keccak_rndc[lVar7] ^ local_308;
        uStack_2d8 = uVar28 ^ uStack_2d8;
        uStack_2d4 = uVar17 ^ uStack_2d4;
      }
    }
    uVar4 = block_len(a);
    memset(local_238,0,0x100);
    local_50 = (undefined1  [16])0x0;
    local_60 = (undefined1  [16])0x0;
    local_70 = (undefined1  [16])0x0;
    local_40 = 0;
    memcpy(local_138,&local_308,200);
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      local_238[lVar7] = local_138[lVar7];
    }
    uVar12 = (ulong)l % (ulong)uVar4;
    uVar11 = (ulong)l;
  }
  else {
    hash_len(a);
    block_len(a);
    uVar4 = hash_len(a);
    block_len(a);
    memset(local_238,0,0x100);
    local_50 = (undefined1  [16])0x0;
    local_60 = (undefined1  [16])0x0;
    local_70 = (undefined1  [16])0x0;
    local_40 = 0;
    memcpy(local_138,&local_308,200);
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      local_238[lVar7] = local_138[lVar7];
    }
    uVar5 = hash_len(a);
    uVar11 = (ulong)uVar5;
    uVar12 = (ulong)uVar4;
  }
  memcpy(output + (uVar11 - uVar12),local_238,uVar12);
  return;
}

Assistant:

static void
digest_(
  Spec_Hash_Definitions_hash_alg a,
  Hacl_Hash_SHA3_state_t *state,
  uint8_t *output,
  uint32_t l
)
{
  Hacl_Hash_SHA3_state_t scrut0 = *state;
  Hacl_Hash_SHA3_hash_buf block_state = scrut0.block_state;
  uint8_t *buf_ = scrut0.buf;
  uint64_t total_len = scrut0.total_len;
  uint32_t r;
  if (total_len % (uint64_t)block_len(a) == 0ULL && total_len > 0ULL)
  {
    r = block_len(a);
  }
  else
  {
    r = (uint32_t)(total_len % (uint64_t)block_len(a));
  }
  uint8_t *buf_1 = buf_;
  uint64_t buf[25U] = { 0U };
  Hacl_Hash_SHA3_hash_buf tmp_block_state = { .fst = a, .snd = buf };
  hash_buf2 scrut = { .fst = block_state, .snd = tmp_block_state };
  uint64_t *s_dst = scrut.snd.snd;
  uint64_t *s_src = scrut.fst.snd;
  memcpy(s_dst, s_src, 25U * sizeof (uint64_t));
  uint32_t ite;
  if (r % block_len(a) == 0U && r > 0U)
  {
    ite = block_len(a);
  }
  else
  {
    ite = r % block_len(a);
  }
  uint8_t *buf_last = buf_1 + r - ite;
  uint8_t *buf_multi = buf_1;
  Spec_Hash_Definitions_hash_alg a1 = tmp_block_state.fst;
  uint64_t *s0 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_multi_sha3(a1, s0, buf_multi, 0U / block_len(a1));
  Spec_Hash_Definitions_hash_alg a10 = tmp_block_state.fst;
  uint64_t *s1 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_last_sha3(a10, s1, buf_last, r);
  Spec_Hash_Definitions_hash_alg a11 = tmp_block_state.fst;
  uint64_t *s = tmp_block_state.snd;
  if (a11 == Spec_Hash_Definitions_Shake128 || a11 == Spec_Hash_Definitions_Shake256)
  {
    for (uint32_t i0 = 0U; i0 < l / block_len(a11); i0++)
    {
      uint8_t hbuf[256U] = { 0U };
      uint64_t ws[32U] = { 0U };
      memcpy(ws, s, 25U * sizeof (uint64_t));
      for (uint32_t i = 0U; i < 32U; i++)
      {
        store64_le(hbuf + i * 8U, ws[i]);
      }
      uint8_t *b0 = output;
      uint8_t *uu____0 = hbuf;
      memcpy(b0 + i0 * block_len(a11), uu____0, block_len(a11) * sizeof (uint8_t));
      for (uint32_t i1 = 0U; i1 < 24U; i1++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i2,
          0U,
          5U,
          1U,
          uint64_t uu____1 = _C[(i2 + 1U) % 5U];
          uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____1 << 1U | uu____1 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____2 = current;
          s[_Y] = uu____2 << r1 | uu____2 >> (64U - r1);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
        s[0U] = s[0U] ^ c;
      }
    }
    uint32_t remOut = l % block_len(a11);
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    memcpy(output + l - remOut, hbuf, remOut * sizeof (uint8_t));
    return;
  }
  for (uint32_t i0 = 0U; i0 < hash_len(a11) / block_len(a11); i0++)
  {
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    uint8_t *b0 = output;
    uint8_t *uu____3 = hbuf;
    memcpy(b0 + i0 * block_len(a11), uu____3, block_len(a11) * sizeof (uint8_t));
    for (uint32_t i1 = 0U; i1 < 24U; i1++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i2,
        0U,
        5U,
        1U,
        uint64_t uu____4 = _C[(i2 + 1U) % 5U];
        uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____4 << 1U | uu____4 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____5 = current;
        s[_Y] = uu____5 << r1 | uu____5 >> (64U - r1);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
      s[0U] = s[0U] ^ c;
    }
  }
  uint32_t remOut = hash_len(a11) % block_len(a11);
  uint8_t hbuf[256U] = { 0U };
  uint64_t ws[32U] = { 0U };
  memcpy(ws, s, 25U * sizeof (uint64_t));
  for (uint32_t i = 0U; i < 32U; i++)
  {
    store64_le(hbuf + i * 8U, ws[i]);
  }
  uint8_t *uu____6 = hbuf;
  memcpy(output + hash_len(a11) - remOut, uu____6, remOut * sizeof (uint8_t));
}